

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

void __thiscall embree::StdStream::StdStream(StdStream *this,istream *cin,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__p;
  
  Stream<int>::Stream(&this->super_Stream<int>);
  (this->super_Stream<int>).super_RefCount._vptr_RefCount = (_func_int **)&PTR__StdStream_002aa190;
  this->cin = cin;
  this->lineNumber = 1;
  this->colNumber = 0;
  this->charNumber = 0;
  __p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)::operator_new(0x20);
  std::__cxx11::string::string((string *)__p,(string *)name);
  std::__shared_ptr<std::__cxx11::string,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::__cxx11::string,void>
            ((__shared_ptr<std::__cxx11::string,(__gnu_cxx::_Lock_policy)2> *)&this->name,__p);
  return;
}

Assistant:

StdStream (std::istream& cin, const std::string& name = "std::stream")
      : cin(cin), lineNumber(1), colNumber(0), charNumber(0), name(std::shared_ptr<std::string>(new std::string(name))) {}